

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ApiPhraseNext(Fts5Context *pUnused,Fts5PhraseIter *pIter,int *piCol,int *piOff)

{
  int iVar1;
  u32 local_2c;
  int *piStack_28;
  int iVal;
  int *piOff_local;
  int *piCol_local;
  Fts5PhraseIter *pIter_local;
  Fts5Context *pUnused_local;
  
  if (pIter->a < pIter->b) {
    piStack_28 = piOff;
    piOff_local = piCol;
    piCol_local = (int *)pIter;
    pIter_local = (Fts5PhraseIter *)pUnused;
    iVar1 = sqlite3Fts5GetVarint32(pIter->a,&local_2c);
    *(long *)piCol_local = *(long *)piCol_local + (long)iVar1;
    if (local_2c == 1) {
      iVar1 = sqlite3Fts5GetVarint32(*(uchar **)piCol_local,&local_2c);
      *(long *)piCol_local = *(long *)piCol_local + (long)iVar1;
      *piOff_local = local_2c;
      *piStack_28 = 0;
      iVar1 = sqlite3Fts5GetVarint32(*(uchar **)piCol_local,&local_2c);
      *(long *)piCol_local = *(long *)piCol_local + (long)iVar1;
    }
    *piStack_28 = (local_2c - 2) + *piStack_28;
  }
  else {
    *piCol = -1;
    *piOff = -1;
  }
  return;
}

Assistant:

static void fts5ApiPhraseNext(
  Fts5Context *pUnused, 
  Fts5PhraseIter *pIter, 
  int *piCol, int *piOff
){
  UNUSED_PARAM(pUnused);
  if( pIter->a>=pIter->b ){
    *piCol = -1;
    *piOff = -1;
  }else{
    int iVal;
    pIter->a += fts5GetVarint32(pIter->a, iVal);
    if( iVal==1 ){
      pIter->a += fts5GetVarint32(pIter->a, iVal);
      *piCol = iVal;
      *piOff = 0;
      pIter->a += fts5GetVarint32(pIter->a, iVal);
    }
    *piOff += (iVal-2);
  }
}